

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  pointer pMVar6;
  unsigned_long uVar7;
  void *pvVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  pointer pvVar12;
  ulong uVar13;
  pointer pBVar14;
  pointer __n;
  float *pfVar15;
  pointer pBVar16;
  int *piVar17;
  pointer pBVar18;
  pointer pfVar19;
  int q;
  int iVar20;
  int iVar21;
  int _c;
  pointer pBVar22;
  int i;
  pointer pBVar23;
  ulong uVar24;
  size_t i_2;
  Mat *pMVar25;
  int j;
  ulong uVar26;
  int i_1;
  long lVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float extraout_XMM0_Db;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  float fVar40;
  float local_228;
  uint uStack_224;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  float confidence;
  float local_1b8;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  float local_108;
  float fStack_104;
  float fStack_f4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  int local_7c;
  undefined1 extraout_var [12];
  
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar24 = 0;
  do {
    pMVar6 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x48) <= uVar24)
    {
      if (all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_start !=
          all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        if (all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          qsort_descent_inplace<ncnn::BBoxRect>
                    (&all_bbox_rects,&all_bbox_scores,0,
                     (int)((ulong)((long)all_bbox_scores.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)all_bbox_scores.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2) + -1);
        }
      }
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fVar34 = this->nms_threshold;
      __n = (pointer)(((long)all_bbox_rects.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)all_bbox_rects.
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x14);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&bbox_rects,(size_type)__n,
                 (allocator_type *)&bbox_scores);
      pfVar15 = &(all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start)->xmax;
      for (pfVar19 = (pointer)0x0; __n != pfVar19; pfVar19 = (pointer)((long)pfVar19 + 1)) {
        uVar3 = ((BBoxRect *)(pfVar15 + -2))->xmin;
        uVar5 = ((BBoxRect *)(pfVar15 + -2))->ymin;
        (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start)->xmin)[(long)pfVar19] =
             ((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) - (float)uVar5) *
             ((float)*(undefined8 *)pfVar15 - (float)uVar3);
        pfVar15 = pfVar15 + 5;
      }
      for (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start = (pointer)0x0;
          bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start < __n;
          bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl
                               .super__Vector_impl_data._M_start + 1)) {
        pBVar14 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
        uVar24 = (ulong)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)picked.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3;
        uVar13 = uVar24 & 0xffffffff;
        if ((int)uVar24 < 1) {
          uVar13 = 0;
        }
        bVar9 = true;
        for (uVar24 = 0; uVar13 != uVar24; uVar24 = uVar24 + 1) {
          uVar7 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar24];
          fVar37 = pBVar14->xmin;
          fVar30 = all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7].xmax;
          fVar29 = 0.0;
          if (fVar37 <= fVar30) {
            pBVar16 = all_bbox_rects.
                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar7;
            fVar38 = pBVar14->xmax;
            fVar35 = pBVar16->xmin;
            if (fVar35 <= fVar38) {
              fVar1 = pBVar14->ymin;
              fVar39 = pBVar16->ymax;
              if (fVar1 <= fVar39) {
                fVar2 = pBVar14->ymax;
                fVar40 = pBVar16->ymin;
                if (fVar40 <= fVar2) {
                  if (fVar38 <= fVar30) {
                    fVar30 = fVar38;
                  }
                  if (fVar35 <= fVar37) {
                    fVar35 = fVar37;
                  }
                  if (fVar2 <= fVar39) {
                    fVar39 = fVar2;
                  }
                  if (fVar40 <= fVar1) {
                    fVar40 = fVar1;
                  }
                  fVar29 = (fVar39 - fVar40) * (fVar30 - fVar35);
                }
              }
            }
          }
          if (fVar34 < fVar29 / (((&(bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->xmin)
                                  [(long)bbox_scores.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start] - fVar29) +
                                (&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin)[uVar7])) {
            bVar9 = false;
          }
        }
        if (bVar9) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&picked,(value_type_conflict5 *)&bbox_scores);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (uVar24 = 0;
          uVar24 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar24 = uVar24 + 1
          ) {
        uVar7 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar24];
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  (&bbox_rects,
                   all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar7);
        std::vector<float,_std::allocator<float>_>::push_back
                  (&bbox_scores,
                   all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar7);
      }
      uVar24 = ((long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x14;
      iVar20 = (int)uVar24;
      if (iVar20 == 0) {
        iVar21 = 0;
      }
      else {
        pMVar25 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ncnn::Mat::create(pMVar25,6,iVar20,4,opt->blob_allocator);
        pvVar8 = pMVar25->data;
        iVar21 = -100;
        if ((pvVar8 != (void *)0x0) && ((long)pMVar25->c * pMVar25->cstep != 0)) {
          iVar21 = 0;
          uVar24 = uVar24 & 0xffffffff;
          if (iVar20 < 1) {
            uVar24 = 0;
          }
          piVar17 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_start)->label;
          for (uVar13 = 0; uVar24 != uVar13; uVar13 = uVar13 + 1) {
            fVar34 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            lVar27 = (long)pMVar25->w * uVar13 * pMVar25->elemsize;
            *(float *)((long)pvVar8 + lVar27) = (float)(*piVar17 + 1);
            *(float *)((long)pvVar8 + lVar27 + 4) = fVar34;
            *(float *)((long)pvVar8 + lVar27 + 8) = ((BBoxRect *)(piVar17 + -4))->xmin;
            *(int *)((long)pvVar8 + lVar27 + 0xc) = piVar17[-3];
            *(int *)((long)pvVar8 + lVar27 + 0x10) = piVar17[-2];
            *(int *)((long)pvVar8 + lVar27 + 0x14) = piVar17[-1];
            piVar17 = piVar17 + 5;
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_00273ffa:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                );
      return iVar21;
    }
    iVar20 = pMVar6[uVar24].c / this->num_box;
    if (iVar20 != this->num_class + 5) {
      iVar21 = -1;
      goto LAB_00273ffa;
    }
    uVar13._0_4_ = pMVar6[uVar24].w;
    uVar13._4_4_ = pMVar6[uVar24].h;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar13;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)&bbox_scores,(long)this->num_box);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&all_box_bbox_scores,(long)this->num_box);
    pMVar25 = pMVar6 + uVar24;
    auVar32._0_4_ = (float)(int)(undefined4)uVar13;
    auVar32._4_4_ = (float)(int)uVar13._4_4_;
    auVar32._8_8_ = 0;
    auVar33 = rcpps(auVar33,auVar32);
    fVar34 = auVar33._0_4_;
    fVar37 = auVar33._4_4_;
    uVar10 = (undefined4)uVar13;
    if ((int)(undefined4)uVar13 < 1) {
      uVar10 = 0;
    }
    fVar34 = (1.0 - auVar32._0_4_ * fVar34) * fVar34 + fVar34;
    fVar37 = (1.0 - auVar32._4_4_ * fVar37) * fVar37 + fVar37;
    uVar11 = uVar13._4_4_;
    if ((int)uVar13._4_4_ < 1) {
      uVar11 = 0;
    }
    lVar27 = 0;
    while( true ) {
      uVar13 = (ulong)this->num_box;
      if ((long)uVar13 <= lVar27) break;
      iVar21 = (int)lVar27 * iVar20;
      uVar4 = *(undefined8 *)((long)(this->biases).data + lVar27 * 8);
      ncnn::Mat::channel((Mat *)&bbox_rects,pMVar25,iVar21);
      pBVar14 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&bbox_rects);
      ncnn::Mat::channel((Mat *)&bbox_rects,pMVar25,iVar21 + 1);
      pBVar16 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&bbox_rects);
      ncnn::Mat::channel((Mat *)&bbox_rects,pMVar25,iVar21 + 2);
      pBVar18 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&bbox_rects);
      ncnn::Mat::channel((Mat *)&bbox_rects,pMVar25,iVar21 + 3);
      pBVar23 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&bbox_rects);
      ncnn::Mat::channel((Mat *)&bbox_rects,pMVar25,iVar21 + 4);
      pBVar22 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ncnn::Mat::~Mat((Mat *)&bbox_rects);
      ncnn::Mat::channel_range((Mat *)&bbox_rects,pMVar25,iVar21 + 5,this->num_class);
      (*this->softmax->_vptr_Layer[9])(this->softmax,(Mat *)&bbox_rects,opt);
      local_108 = (float)uVar4;
      fStack_104 = (float)((ulong)uVar4 >> 0x20);
      for (uVar13 = 0; uVar13 != uVar11; uVar13 = uVar13 + 1) {
        for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
          fVar30 = pBVar18->xmin;
          local_1b8 = pBVar23->xmin;
          fStack_f4 = -pBVar16->xmin;
          fVar29 = expf(-pBVar14->xmin);
          auVar31._0_4_ = expf(fStack_f4);
          auVar31._4_12_ = extraout_var;
          auVar36._0_4_ = fVar29 + 1.0;
          auVar36._4_4_ = auVar31._0_4_ + 1.0;
          auVar36._8_4_ = extraout_XMM0_Db + 0.0;
          auVar36._12_4_ = extraout_var._0_4_ + 0.0;
          auVar32 = rcpps(auVar31,auVar36);
          fVar29 = auVar32._0_4_;
          fVar38 = auVar32._4_4_;
          fVar35 = ((float)(int)uVar26 + fVar29 + (1.0 - auVar36._0_4_ * fVar29) * fVar29) * fVar34;
          fVar38 = ((float)(int)uVar13 + fVar38 + (1.0 - auVar36._4_4_ * fVar38) * fVar38) * fVar37;
          local_1b8 = expf(local_1b8);
          fVar30 = expf(fVar30);
          fVar30 = fVar30 * local_108 * 0.5 * fVar34;
          fVar29 = local_1b8 * fStack_104 * 0.5 * fVar37;
          local_1b8 = expf(-pBVar22->xmin);
          local_1b8 = local_1b8 + 1.0;
          local_228 = 0.0;
          iVar21 = 0;
          for (_c = 0; _c < this->num_class; _c = _c + 1) {
            ncnn::Mat::channel((Mat *)&picked,(Mat *)&bbox_rects,_c);
            fVar1 = *(float *)((long)picked.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              uVar26 * 4 +
                              (long)local_7c * uVar13 *
                              (long)picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ncnn::Mat::~Mat((Mat *)&picked);
            bVar9 = local_228 < fVar1;
            if (local_228 <= fVar1) {
              local_228 = fVar1;
            }
            if (bVar9) {
              iVar21 = _c;
            }
          }
          confidence = local_228 / local_1b8;
          if (this->confidence_threshold <= confidence) {
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44(picked.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar21);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(fVar38 - fVar29,fVar35 - fVar30);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)CONCAT44(fVar29 + fVar38,fVar30 + fVar35);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar27 * 6),(value_type *)&picked);
            std::vector<float,_std::allocator<float>_>::push_back
                      (all_box_bbox_scores.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar27,&confidence);
          }
          pBVar14 = (pointer)&pBVar14->ymin;
          pBVar16 = (pointer)&pBVar16->ymin;
          pBVar18 = (pointer)&pBVar18->ymin;
          pBVar23 = (pointer)&pBVar23->ymin;
          pBVar22 = (pointer)&pBVar22->ymin;
        }
      }
      ncnn::Mat::~Mat((Mat *)&bbox_rects);
      lVar27 = lVar27 + 1;
    }
    lVar27 = 8;
    for (lVar28 = 0;
        pvVar12 = all_box_bbox_scores.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar28 < (int)uVar13;
        lVar28 = lVar28 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar27 + -8),
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar27));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&all_bbox_scores,
                 (const_iterator)
                 all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pvVar12 + lVar27 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)
                  ((long)&(pvVar12->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar27));
      uVar13 = (ulong)(uint)this->num_box;
      lVar27 = lVar27 + 0x18;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&all_box_bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)&bbox_scores);
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / w);
                    float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / h);

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}